

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O2

int fprint<unsigned_long&,unsigned_long>
              (FILE *out,char *fmt,unsigned_long *args,unsigned_long *args_1)

{
  size_t sVar1;
  string str;
  
  stringformat<unsigned_long&,unsigned_long>(&str,fmt,args,args_1);
  sVar1 = fwrite(str._M_dataplus._M_p,str._M_string_length,1,(FILE *)out);
  std::__cxx11::string::~string((string *)&str);
  return (int)sVar1;
}

Assistant:

int fprint(FILE *out, const char *fmt, ARGS&&...args)
{
    auto str = stringformat(fmt, std::forward<ARGS>(args)...);
    return fwrite(str.c_str(), str.size(), 1, out);
}